

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeAddrMode5Operand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  DecodeStatus In;
  uint uVar4;
  MCInst *in_RCX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint imm;
  uint U;
  uint Rn;
  DecodeStatus S;
  void *in_stack_ffffffffffffffc0;
  uchar Offset;
  DecodeStatus local_4;
  
  local_4 = MCDisassembler_Success;
  fieldFromInstruction_4(in_ESI,9,4);
  uVar2 = fieldFromInstruction_4(in_ESI,8,1);
  uVar3 = fieldFromInstruction_4(in_ESI,0,8);
  In = DecodeGPRRegisterClass(in_RCX,local_4,CONCAT44(uVar2,uVar3),in_stack_ffffffffffffffc0);
  Offset = (uchar)uVar3;
  _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,In);
  if (_Var1) {
    if (uVar2 == 0) {
      uVar4 = ARM_AM_getAM5Opc(ARM_AM_sub,Offset);
      MCOperand_CreateImm0(in_RDI,(ulong)uVar4);
    }
    else {
      uVar4 = ARM_AM_getAM5Opc(ARM_AM_add,Offset);
      MCOperand_CreateImm0(in_RDI,(ulong)uVar4);
    }
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeAddrMode5Operand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Val, 9, 4);
	unsigned U = fieldFromInstruction_4(Val, 8, 1);
	unsigned imm = fieldFromInstruction_4(Val, 0, 8);

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;

	if (U)
		MCOperand_CreateImm0(Inst, ARM_AM_getAM5Opc(ARM_AM_add, (unsigned char)imm));
	else
		MCOperand_CreateImm0(Inst, ARM_AM_getAM5Opc(ARM_AM_sub, (unsigned char)imm));

	return S;
}